

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O2

_Bool GetKeyWord(ConfigScanner *sc)

{
  char *pcVar1;
  
  if (sc == (ConfigScanner *)0x0) {
    return false;
  }
  if (*sc->ptr == '\"') {
    sc->ptr = sc->ptr + 1;
    pcVar1 = GetQuote(sc);
  }
  else {
    pcVar1 = GetString(sc);
  }
  if (pcVar1 != (char *)0x0) {
    sc->current_key = pcVar1;
  }
  return pcVar1 != (char *)0x0;
}

Assistant:

bool GetKeyWord(ConfigScanner *sc)
{
	if (sc == NULL)
	{
		return false;
	}
	char ch = *sc->ptr;
	char *key;
	if (ch == '"')
	{
		sc->ptr++;
		key = GetQuote(sc);
		if (key == NULL)
		{
			return false;
		}
	}
	else
	{
		key = GetString(sc);
		if (key == NULL)
		{
			return false;
		}
	}
	sc->current_key = key;
	return true;
}